

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionSystemBullet.cpp
# Opt level: O1

void __thiscall
chrono::collision::ChDebugDrawer::drawContactPoint
          (ChDebugDrawer *this,cbtVector3 *PointOnB,cbtVector3 *normalOnB,cbtScalar distance,
          int lifeTime,cbtVector3 *color)

{
  (**(code **)(*(long *)this->m_vis + 0x18))();
  (**(code **)(*(long *)this->m_vis + 0x10))();
  return;
}

Assistant:

void drawContactPoint(const cbtVector3& PointOnB,
                          const cbtVector3& normalOnB,
                          cbtScalar distance,
                          int lifeTime,
                          const cbtVector3& color) override {
        cbtVector3 from = PointOnB;
        cbtVector3 to = PointOnB + m_vis->GetNormalScale() * normalOnB;
        m_vis->DrawLine(ChVector<>(from.x(), from.y(), from.z()), ChVector<>(to.x(), to.y(), to.z()),
                        ChColor(color.x(), color.y(), color.z()));
    }